

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_3d2978::ArgParser::argJsonHelp(ArgParser *this,string *parameter)

{
  element_type *this_00;
  int iVar1;
  uint uVar2;
  long *plVar3;
  Pipeline *this_01;
  size_type *psVar4;
  shared_ptr<Pipeline> sVar5;
  string local_70;
  QPDFLogger local_50;
  undefined1 local_40 [32];
  
  uVar2 = 2;
  if (parameter->_M_string_length != 0) {
    iVar1 = std::__cxx11::string::compare((char *)parameter);
    if (iVar1 != 0) {
      uVar2 = QUtil::string_to_int((parameter->_M_dataplus)._M_p);
      if (uVar2 - 3 < 0xfffffffe) {
        local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_40;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"unsupported json version ","");
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_50,(ulong)(parameter->_M_dataplus)._M_p);
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_70.field_2._M_allocated_capacity = *psVar4;
          local_70.field_2._8_8_ = plVar3[3];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        }
        else {
          local_70.field_2._M_allocated_capacity = *psVar4;
          local_70._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_70._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        QPDFArgParser::usage(&this->ap,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)local_40) {
          operator_delete(local_50.m.
                          super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,local_40._0_8_ + 1);
        }
      }
    }
  }
  QPDFLogger::defaultLogger();
  sVar5 = QPDFLogger::getInfo(&local_50,(bool)local_40[0x10]);
  this_00 = local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  QPDFJob::json_out_schema_abi_cxx11_
            (&local_70,(QPDFJob *)(ulong)uVar2,
             (int)sVar5.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  this_01 = Pipeline::operator<<((Pipeline *)this_00,&local_70);
  Pipeline::operator<<(this_01,"\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._24_8_);
  }
  return;
}

Assistant:

void
ArgParser::argJsonHelp(std::string const& parameter)
{
    int version = JSON::LATEST;
    if (!(parameter.empty() || (parameter == "latest"))) {
        version = QUtil::string_to_int(parameter.c_str());
    }
    if ((version < 1) || (version > JSON::LATEST)) {
        usage(std::string("unsupported json version ") + parameter);
    }
    *QPDFLogger::defaultLogger()->getInfo() << QPDFJob::json_out_schema(version) << "\n";
}